

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem.c
# Opt level: O0

void coda_mem_done(void)

{
  long lVar1;
  int local_c;
  int i;
  
  for (local_c = 0; local_c < 0xb; local_c = local_c + 1) {
    lVar1 = __tls_get_addr(&PTR_00246d10);
    if (*(long *)(lVar1 + 0x1060 + (long)local_c * 8) != 0) {
      lVar1 = __tls_get_addr(&PTR_00246d10);
      coda_mem_type_delete(*(coda_dynamic_type **)(lVar1 + 0x1060 + (long)local_c * 8));
    }
    lVar1 = __tls_get_addr(&PTR_00246d10);
    *(undefined8 *)(lVar1 + 0x1060 + (long)local_c * 8) = 0;
  }
  for (local_c = 0; local_c < 0xb; local_c = local_c + 1) {
    lVar1 = __tls_get_addr(&PTR_00246d10);
    if (*(long *)(lVar1 + 0x10c0 + (long)local_c * 8) != 0) {
      lVar1 = __tls_get_addr(&PTR_00246d10);
      coda_mem_type_delete(*(coda_dynamic_type **)(lVar1 + 0x10c0 + (long)local_c * 8));
    }
    lVar1 = __tls_get_addr(&PTR_00246d10);
    *(undefined8 *)(lVar1 + 0x10c0 + (long)local_c * 8) = 0;
  }
  return;
}

Assistant:

void coda_mem_done(void)
{
    int i;

    for (i = 0; i < num_empty_record_singletons; i++)
    {
        if (empty_record_singleton[i] != NULL)
        {
            coda_mem_type_delete((coda_dynamic_type *)empty_record_singleton[i]);
        }
        empty_record_singleton[i] = NULL;
    }
    for (i = 0; i < num_no_data_singletons; i++)
    {
        if (no_data_singleton[i] != NULL)
        {
            coda_mem_type_delete((coda_dynamic_type *)no_data_singleton[i]);
        }
        no_data_singleton[i] = NULL;
    }
}